

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

ER __thiscall slang::ast::BlockStatement::evalImpl(BlockStatement *this,EvalContext *context)

{
  ER EVar1;
  
  if (this->blockKind == Sequential) {
    EVar1 = Statement::eval(this->body,context);
    if ((EVar1 == Disable) &&
       (EVar1 = Disable, (StatementBlockSymbol *)context->disableTarget == this->blockSymbol)) {
      context->disableTarget = (Symbol *)0x0;
      (context->disableRange).startLoc = (SourceLocation)0x0;
      (context->disableRange).endLoc = (SourceLocation)0x0;
      EVar1 = Success;
    }
  }
  else {
    EvalContext::addDiag(context,(DiagCode)0x16000c,(this->super_Statement).sourceRange);
    EVar1 = Fail;
  }
  return EVar1;
}

Assistant:

ER BlockStatement::evalImpl(EvalContext& context) const {
    if (blockKind != StatementBlockKind::Sequential) {
        context.addDiag(diag::ConstEvalParallelBlockNotConst, sourceRange);
        return ER::Fail;
    }

    ER result = body.eval(context);
    if (result == ER::Disable) {
        // Check if the disable statement we evaluated was targeting this block.
        // If it was, we've already skipped enough statements, so just clear out
        // the target and continue on.
        auto target = context.getDisableTarget();
        SLANG_ASSERT(target);
        if (target == blockSymbol) {
            result = ER::Success;
            context.setDisableTarget(nullptr, {});
        }
    }

    return result;
}